

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSAttributeUse * __thiscall
xercesc_4_0::XSObjectFactory::createXSAttributeUse
          (XSObjectFactory *this,XSAttributeDeclaration *xsAttDecl,XSModel *xsModel)

{
  XSAttributeUse *this_00;
  
  this_00 = (XSAttributeUse *)XMemory::operator_new(0x40,this->fMemoryManager);
  XSAttributeUse::XSAttributeUse(this_00,xsAttDecl,xsModel,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
            (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)this_00)
  ;
  return this_00;
}

Assistant:

XSAttributeUse*
XSObjectFactory::createXSAttributeUse(XSAttributeDeclaration* const xsAttDecl,
                               XSModel* const xsModel)
{
    XSAttributeUse* attrUse = new (fMemoryManager) XSAttributeUse(xsAttDecl, xsModel, fMemoryManager);
    fDeleteVector->addElement(attrUse);

    return attrUse;
}